

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopedTransaction.cpp
# Opt level: O1

void __thiscall f8n::db::ScopedTransaction::CommitAndRestart(ScopedTransaction *this)

{
  Connection *this_00;
  char *sql;
  
  this_00 = this->connection;
  this_00->transactionCounter = this_00->transactionCounter + -1;
  if (this_00->transactionCounter == 0) {
    sql = "COMMIT TRANSACTION";
    if (this->canceled != false) {
      sql = "ROLLBACK TRANSACTION";
    }
    Connection::Execute(this_00,sql);
  }
  this->canceled = false;
  if (this->connection->transactionCounter == 0) {
    Connection::Execute(this->connection,"BEGIN IMMEDIATE TRANSACTION");
  }
  this->connection->transactionCounter = this->connection->transactionCounter + 1;
  return;
}

Assistant:

void ScopedTransaction::CommitAndRestart() {
    this->End();
    this->Begin();
}